

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextToken(Lexer *this)

{
  uint __c;
  int iVar1;
  void *pvVar2;
  pointer *__ptr;
  Lexer *in_RSI;
  Error<pfederc::LexerErrorCode> *local_48;
  undefined1 local_40 [16];
  istream *piStack_30;
  _Alloc_hider local_28;
  
  while( true ) {
    __c = in_RSI->currentChar;
    if ((0x20 < (ulong)__c) || ((0x100000a00U >> ((ulong)__c & 0x3f) & 1) == 0)) break;
    nextChar(in_RSI);
  }
  in_RSI->currentStartIndex = in_RSI->currentEndIndex;
  iVar1 = isalpha(__c);
  if ((__c == 0x5f) || (iVar1 != 0)) {
    nextTokenId(this);
  }
  else if (((byte)__c < 0xe) && ((0x2401U >> (__c & 0x1f) & 1) != 0)) {
    nextTokenLine(this);
  }
  else {
    pvVar2 = memchr(")]}",__c,4);
    if (pvVar2 == (void *)0x0) {
      if (__c == 0x27) {
        nextTokenChar(this);
      }
      else if (__c == 0x22) {
        nextTokenString(this);
      }
      else if (__c - 0x30 < 10) {
        nextTokenNum(this);
      }
      else {
        nextTokenOperator((Lexer *)local_40);
        if ((_func_int **)local_40._0_8_ == (_func_int **)0x0) {
          if (in_RSI->currentChar == -1) {
            nextTokenEOF(this);
          }
          else if (in_RSI->currentChar == 0x23) {
            nextTokenCapability(this);
          }
          else {
            getCurrentCursor((Position *)(local_40 + 8),in_RSI);
            local_48 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
            local_48->logLevel = LVL_ERROR;
            local_48->err = LEX_ERR_GENERAL_INVALID_CHARACTER;
            (local_48->pos).line = local_40._8_8_;
            (local_48->pos).startIndex = (size_t)piStack_30;
            (local_48->pos).endIndex = (size_t)local_28._M_p;
            (local_48->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (local_48->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_48->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                                *)in_RSI);
            if (local_48 != (Error<pfederc::LexerErrorCode> *)0x0) {
              std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                        ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_48,
                         local_48);
            }
          }
          if ((_func_int **)local_40._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_40._0_8_ + 8))();
          }
        }
        else {
          this->_vptr_Lexer = (_func_int **)local_40._0_8_;
        }
      }
    }
    else {
      nextTokenBracket(this);
    }
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextToken() noexcept {
  // Ignore spaces
  skipSpace();
  // set token starting point
  currentStartIndex = currentEndIndex;

  if (std::isalpha(currentChar) || currentChar == '_')
    return nextTokenId();

  if (_isNewLineCharacter(currentChar))
    return nextTokenLine();

  if (std::strchr(")]}", currentChar))
    return nextTokenBracket();

  if (currentChar == '"')
    return nextTokenString();

  if (currentChar == '\'')
    return nextTokenChar();

  if (std::isdigit(currentChar))
    return nextTokenNum();

  std::unique_ptr<Token> result(nextTokenOperator());
  if (result)
    return result;

  if (currentChar == '#')
    return nextTokenCapability();

  if (currentChar == std::char_traits<char>::eof())
    return nextTokenEOF();

  return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_GENERAL_INVALID_CHARACTER,
      getCurrentCursor()));
}